

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int ApplyPalette(uint32_t *src,uint32_t src_stride,uint32_t *dst,uint32_t dst_stride,
                uint32_t *palette,int palette_size,int width,int height,int xbits,WebPPicture *pic)

{
  uint32_t color;
  uint32_t uVar1;
  int iVar2;
  uint in_ECX;
  uint32_t *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint32_t *in_R8;
  int in_R9D;
  uint32_t pix_4;
  uint32_t prev_idx_4;
  uint32_t prev_pix_4;
  uint32_t palette_sorted [256];
  uint32_t idx_map [256];
  uint32_t pix_3;
  uint32_t prev_idx_3;
  uint32_t prev_pix_3;
  uint32_t pix_2;
  uint32_t prev_idx_2;
  uint32_t prev_pix_2;
  uint32_t pix_1;
  uint32_t prev_idx_1;
  uint32_t prev_pix_1;
  uint32_t ind;
  int use_LUT;
  _func_uint32_t_uint32_t *hash_functions [3];
  uint16_t buffer [2048];
  int j;
  int i;
  uint32_t pix;
  uint32_t prev_idx;
  uint32_t prev_pix;
  int y;
  int x;
  uint8_t *tmp_row;
  undefined4 in_stack_ffffffffffffe740;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffe744;
  uint32_t *in_stack_ffffffffffffe748;
  uint32_t *in_stack_ffffffffffffe750;
  uint32_t in_stack_ffffffffffffe75c;
  uint32_t *in_stack_ffffffffffffe760;
  undefined4 local_14b8 [257];
  uint32_t local_10b4;
  uint local_10b0;
  uint32_t local_10ac;
  uint32_t local_10a8;
  uint local_10a4;
  uint32_t local_10a0;
  uint32_t local_109c;
  uint local_1098;
  uint32_t local_1094;
  uint local_1090;
  int local_108c;
  code *local_1088 [4];
  ushort local_1068 [2054];
  int local_5c;
  int local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t local_4c;
  int local_48;
  int local_44;
  uint8_t *local_40;
  int local_34;
  uint32_t *local_30;
  uint local_24;
  uint32_t *local_20;
  uint local_14;
  long local_10;
  int local_4;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = (uint8_t *)
             WebPSafeMalloc((uint64_t)in_stack_ffffffffffffe748,
                            CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740));
  if (local_40 == (uint8_t *)0x0) {
    local_4 = WebPEncodingSetError((WebPPicture *)palette_sorted._16_8_,VP8_ENC_ERROR_OUT_OF_MEMORY)
    ;
  }
  else {
    if (local_34 < 4) {
      local_4c = *local_30;
      local_50 = 0;
      for (local_48 = 0; local_48 < (int)palette_sorted[0]; local_48 = local_48 + 1) {
        for (local_44 = 0; local_44 < (int)prev_idx_4; local_44 = local_44 + 1) {
          local_54 = *(uint32_t *)(local_10 + (long)local_44 * 4);
          if (local_54 != local_4c) {
            local_50 = SearchColorGreedy(local_30,local_34,local_54);
            local_4c = local_54;
          }
          local_40[local_44] = (uint8_t)local_50;
        }
        (*VP8LBundleColorMap)(local_40,prev_idx_4,palette_sorted[2],local_20);
        local_10 = local_10 + (ulong)local_14 * 4;
        local_20 = local_20 + local_24;
      }
    }
    else {
      local_1088[0] = ApplyPaletteHash0;
      local_1088[1] = ApplyPaletteHash1;
      local_1088[2] = ApplyPaletteHash2;
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        local_108c = 1;
        memset(local_1068,0xff,0x1000);
        for (local_5c = 0; local_5c < local_34; local_5c = local_5c + 1) {
          local_1090 = (*local_1088[local_58])(local_30[local_5c]);
          if (local_1068[local_1090] != 0xffff) {
            local_108c = 0;
            break;
          }
          local_1068[local_1090] = (ushort)local_5c;
        }
        if (local_108c != 0) break;
      }
      if (local_58 == 0) {
        local_1094 = *local_30;
        local_1098 = 0;
        for (local_48 = 0; local_48 < (int)palette_sorted[0]; local_48 = local_48 + 1) {
          for (local_44 = 0; local_44 < (int)prev_idx_4; local_44 = local_44 + 1) {
            local_109c = *(uint32_t *)(local_10 + (long)local_44 * 4);
            if (local_109c != local_1094) {
              uVar1 = ApplyPaletteHash0(local_109c);
              local_1098 = (uint)local_1068[uVar1];
              local_1094 = local_109c;
            }
            local_40[local_44] = (uint8_t)local_1098;
          }
          (*VP8LBundleColorMap)(local_40,prev_idx_4,palette_sorted[2],local_20);
          local_10 = local_10 + (ulong)local_14 * 4;
          local_20 = local_20 + local_24;
        }
      }
      else if (local_58 == 1) {
        local_10a0 = *local_30;
        local_10a4 = 0;
        for (local_48 = 0; local_48 < (int)palette_sorted[0]; local_48 = local_48 + 1) {
          for (local_44 = 0; local_44 < (int)prev_idx_4; local_44 = local_44 + 1) {
            local_10a8 = *(uint32_t *)(local_10 + (long)local_44 * 4);
            if (local_10a8 != local_10a0) {
              uVar1 = ApplyPaletteHash1(local_10a8);
              local_10a4 = (uint)local_1068[uVar1];
              local_10a0 = local_10a8;
            }
            local_40[local_44] = (uint8_t)local_10a4;
          }
          (*VP8LBundleColorMap)(local_40,prev_idx_4,palette_sorted[2],local_20);
          local_10 = local_10 + (ulong)local_14 * 4;
          local_20 = local_20 + local_24;
        }
      }
      else if (local_58 == 2) {
        local_10ac = *local_30;
        local_10b0 = 0;
        for (local_48 = 0; local_48 < (int)palette_sorted[0]; local_48 = local_48 + 1) {
          for (local_44 = 0; local_44 < (int)prev_idx_4; local_44 = local_44 + 1) {
            local_10b4 = *(uint32_t *)(local_10 + (long)local_44 * 4);
            if (local_10b4 != local_10ac) {
              uVar1 = ApplyPaletteHash2(local_10b4);
              local_10b0 = (uint)local_1068[uVar1];
              local_10ac = local_10b4;
            }
            local_40[local_44] = (uint8_t)local_10b0;
          }
          (*VP8LBundleColorMap)(local_40,prev_idx_4,palette_sorted[2],local_20);
          local_10 = local_10 + (ulong)local_14 * 4;
          local_20 = local_20 + local_24;
        }
      }
      else {
        PrepareMapToPalette(in_stack_ffffffffffffe760,in_stack_ffffffffffffe75c,
                            in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
        uVar1 = *local_30;
        uVar3 = 0;
        for (local_48 = 0; local_48 < (int)palette_sorted[0]; local_48 = local_48 + 1) {
          for (local_44 = 0; local_44 < (int)prev_idx_4; local_44 = local_44 + 1) {
            color = *(uint32_t *)(local_10 + (long)local_44 * 4);
            if (color != uVar1) {
              iVar2 = SearchColorNoIdx((uint32_t *)&stack0xffffffffffffe748,color,local_34);
              uVar3 = local_14b8[iVar2];
              uVar1 = color;
            }
            local_40[local_44] = (uint8_t)uVar3;
          }
          (*VP8LBundleColorMap)(local_40,prev_idx_4,palette_sorted[2],local_20);
          local_10 = local_10 + (ulong)local_14 * 4;
          local_20 = local_20 + local_24;
        }
      }
    }
    WebPSafeFree((void *)0x181157);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ApplyPalette(const uint32_t* src, uint32_t src_stride, uint32_t* dst,
                        uint32_t dst_stride, const uint32_t* palette,
                        int palette_size, int width, int height, int xbits,
                        const WebPPicture* const pic) {
  // TODO(skal): this tmp buffer is not needed if VP8LBundleColorMap() can be
  // made to work in-place.
  uint8_t* const tmp_row = (uint8_t*)WebPSafeMalloc(width, sizeof(*tmp_row));
  int x, y;

  if (tmp_row == NULL) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  if (palette_size < APPLY_PALETTE_GREEDY_MAX) {
    APPLY_PALETTE_FOR(SearchColorGreedy(palette, palette_size, pix));
  } else {
    int i, j;
    uint16_t buffer[PALETTE_INV_SIZE];
    uint32_t (*const hash_functions[])(uint32_t) = {
        ApplyPaletteHash0, ApplyPaletteHash1, ApplyPaletteHash2
    };

    // Try to find a perfect hash function able to go from a color to an index
    // within 1 << PALETTE_INV_SIZE_BITS in order to build a hash map to go
    // from color to index in palette.
    for (i = 0; i < 3; ++i) {
      int use_LUT = 1;
      // Set each element in buffer to max uint16_t.
      memset(buffer, 0xff, sizeof(buffer));
      for (j = 0; j < palette_size; ++j) {
        const uint32_t ind = hash_functions[i](palette[j]);
        if (buffer[ind] != 0xffffu) {
          use_LUT = 0;
          break;
        } else {
          buffer[ind] = j;
        }
      }
      if (use_LUT) break;
    }

    if (i == 0) {
      APPLY_PALETTE_FOR(buffer[ApplyPaletteHash0(pix)]);
    } else if (i == 1) {
      APPLY_PALETTE_FOR(buffer[ApplyPaletteHash1(pix)]);
    } else if (i == 2) {
      APPLY_PALETTE_FOR(buffer[ApplyPaletteHash2(pix)]);
    } else {
      uint32_t idx_map[MAX_PALETTE_SIZE];
      uint32_t palette_sorted[MAX_PALETTE_SIZE];
      PrepareMapToPalette(palette, palette_size, palette_sorted, idx_map);
      APPLY_PALETTE_FOR(
          idx_map[SearchColorNoIdx(palette_sorted, pix, palette_size)]);
    }
  }
  WebPSafeFree(tmp_row);
  return 1;
}